

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

shared_ptr<wallet::CWallet> __thiscall
wallet::TestLoadWallet
          (wallet *this,
          unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> database,
          WalletContext *context,uint64_t create_flags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> sVar4;
  vector<bilingual_str,_std::allocator<bilingual_str>_> warnings;
  bilingual_str error;
  long *local_c0;
  vector<bilingual_str,_std::allocator<bilingual_str>_> local_b8;
  string local_98;
  bilingual_str local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_78.original.field_2;
  local_78.original._M_string_length = 0;
  local_78.original.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_78.translated.field_2;
  local_78.translated._M_string_length = 0;
  local_78.translated.field_2._M_local_buf[0] = '\0';
  local_b8.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78.original._M_dataplus._M_p = (pointer)paVar1;
  local_78.translated._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
  local_c0 = *(long **)database._M_t.
                       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
  *(undefined8 *)
   database._M_t.
   super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>._M_t.
   super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>.
   super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl = 0;
  CWallet::Create((CWallet *)this,context,&local_98,
                  (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>)
                  &local_c0,create_flags,&local_78,&local_b8);
  if (local_c0 != (long *)0x0) {
    (**(code **)(*local_c0 + 8))();
  }
  local_c0 = (long *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  NotifyWalletLoaded(context,(shared_ptr<wallet::CWallet> *)this);
  if (context->chain != (Chain *)0x0) {
    CWallet::postInitProcess(*(CWallet **)this);
  }
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector(&local_b8);
  _Var3._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.translated._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.translated._M_dataplus._M_p,
                    CONCAT71(local_78.translated.field_2._M_allocated_capacity._1_7_,
                             local_78.translated.field_2._M_local_buf[0]) + 1);
    _Var3._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.original._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.original._M_dataplus._M_p,
                    CONCAT71(local_78.original.field_2._M_allocated_capacity._1_7_,
                             local_78.original.field_2._M_local_buf[0]) + 1);
    _Var3._M_pi = extraout_RDX_01;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    sVar4.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var3._M_pi;
    sVar4.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<wallet::CWallet>)
           sVar4.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<CWallet> TestLoadWallet(std::unique_ptr<WalletDatabase> database, WalletContext& context, uint64_t create_flags)
{
    bilingual_str error;
    std::vector<bilingual_str> warnings;
    auto wallet = CWallet::Create(context, "", std::move(database), create_flags, error, warnings);
    NotifyWalletLoaded(context, wallet);
    if (context.chain) {
        wallet->postInitProcess();
    }
    return wallet;
}